

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

unsigned_short process_metadata(fb_parser_t *P,fb_metadata_t *m,uint16_t expect,fb_metadata_t **out)

{
  uint uVar1;
  int iVar2;
  fb_name_t *pfVar3;
  fb_attribute_t *a;
  int type;
  uint n;
  uint i;
  uint16_t flags;
  fb_metadata_t **out_local;
  fb_metadata_t *pfStack_18;
  uint16_t expect_local;
  fb_metadata_t *m_local;
  fb_parser_t *P_local;
  
  a._4_4_ = 100;
  memset(out,0,0x70);
  n._2_2_ = 0;
  for (pfStack_18 = m; pfStack_18 != (fb_metadata_t *)0x0 && a._4_4_ != 0;
      pfStack_18 = pfStack_18->link) {
    pfVar3 = find_fb_name_by_token(&((P->schema).root_schema)->attribute_index,pfStack_18->ident);
    if (pfVar3 == (fb_name_t *)0x0) {
      error_tok(P,pfStack_18->ident,"unknown attribute not declared");
    }
    else {
      uVar1 = *(uint *)&pfVar3[1].link;
      if (uVar1 != 0) {
        if ((1 << ((byte)uVar1 & 0x1f) & (uint)expect) == 0) {
          error_tok(P,pfStack_18->ident,"known attribute not expected in this context");
        }
        else {
          n._2_2_ = n._2_2_ | (ushort)(1 << ((byte)uVar1 & 0x1f));
          if (out[uVar1] == (fb_metadata_t *)0x0) {
            out[uVar1] = pfStack_18;
            iVar2 = fb_known_attribute_types[uVar1];
            if ((iVar2 == 0) && ((pfStack_18->value).type != 0)) {
              error_tok(P,pfStack_18->ident,"known attribute does not expect a value");
            }
            else if ((iVar2 == 3) && ((pfStack_18->value).type != 3)) {
              error_tok(P,pfStack_18->ident,"known attribute expects a string");
            }
            else if ((iVar2 == 6) && ((pfStack_18->value).type != 6)) {
              error_tok(P,pfStack_18->ident,"known attribute expects an unsigned integer");
            }
            else if ((iVar2 == 5) &&
                    (((pfStack_18->value).type != 6 && ((pfStack_18->value).type != 5)))) {
              error_tok(P,pfStack_18->ident,"known attribute expects an integer");
            }
            else if ((iVar2 == 7) && ((pfStack_18->value).type != 7)) {
              error_tok(P,pfStack_18->ident,"known attribute expects \'true\' or \'false\'");
            }
          }
          else {
            error_tok(P,pfStack_18->ident,"known attribute listed multiple times");
          }
        }
      }
    }
    a._4_4_ = a._4_4_ + -1;
  }
  if (pfStack_18 != (fb_metadata_t *)0x0) {
    error_tok(P,pfStack_18->ident,"too many attributes");
  }
  return n._2_2_;
}

Assistant:

static inline unsigned short process_metadata(fb_parser_t *P, fb_metadata_t *m,
        uint16_t expect, fb_metadata_t *out[KNOWN_ATTR_COUNT])
{
    uint16_t flags;
    unsigned int i, n = FLATCC_ATTR_MAX;
    int type;
    fb_attribute_t *a;

    memset(out, 0, sizeof(out[0]) * KNOWN_ATTR_COUNT);
    for (flags = 0; m && n; --n, m = m->link) {
        a = (fb_attribute_t *)find_fb_name_by_token(&P->schema.root_schema->attribute_index, m->ident);
        if (!a) {
            error_tok(P, m->ident, "unknown attribute not declared");
            continue;
        }
        if (!(i = a->known)) {
            continue;
        }
        if (!((1 << i) & expect)) {
            error_tok(P, m->ident, "known attribute not expected in this context");
            continue;
        }
        flags |= 1 << i;
        if (out[i]) {
            error_tok(P, m->ident, "known attribute listed multiple times");
            continue;
        }
        out[i] = m;
        type = fb_known_attribute_types[i];
        if (type == vt_missing && m->value.type != vt_missing) {
            error_tok(P, m->ident, "known attribute does not expect a value");
            continue;
        }
        if (type == vt_string && m->value.type != vt_string) {
            error_tok(P, m->ident, "known attribute expects a string");
            continue;
        }
        if (type == vt_uint && m->value.type != vt_uint) {
            error_tok(P, m->ident, "known attribute expects an unsigned integer");
            continue;
        }
        if (type == vt_int && m->value.type != vt_uint && m->value.type != vt_int) {
            error_tok(P, m->ident, "known attribute expects an integer");
            continue;
        }
        if (type == vt_bool && m->value.type != vt_bool) {
            error_tok(P, m->ident, "known attribute expects 'true' or 'false'");
            continue;
        }
    }
    if (m) {
        error_tok(P, m->ident, "too many attributes");
    }
    return flags;
}